

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

bool __thiscall cmQtAutoGenInitializer::SetupWriteRccInfo(cmQtAutoGenInitializer *this)

{
  bool bVar1;
  vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_> *this_00;
  reference value;
  element_type *peVar2;
  allocator<char> local_451;
  string local_450;
  allocator<char> local_429;
  string local_428;
  string local_408;
  allocator<char> local_3e1;
  string local_3e0;
  allocator<char> local_3b9;
  string local_3b8;
  allocator<char> local_391;
  string local_390;
  allocator<char> local_369;
  string local_368;
  allocator<char> local_341;
  string local_340;
  allocator<char> local_319;
  string local_318;
  allocator<char> local_2f1;
  string local_2f0;
  allocator<char> local_2c9;
  string local_2c8;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [8];
  InfoWriter info;
  anon_class_8_1_8991fb9c MfDef;
  Qrc *qrc;
  iterator __end1;
  iterator __begin1;
  vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_> *__range1;
  cmQtAutoGenInitializer *this_local;
  
  this_00 = &(this->Rcc).Qrcs;
  __end1 = std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>::
           begin(this_00);
  qrc = (Qrc *)std::
               vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>::
               end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
                                *)&qrc);
    if (!bVar1) break;
    value = __gnu_cxx::
            __normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
            ::operator*(&__end1);
    info.Value_.limit_ = (ptrdiff_t)this;
    anon_unknown.dwarf_faacfb::InfoWriter::InfoWriter((InfoWriter *)local_60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"MULTI_CONFIG",&local_81)
    ;
    anon_unknown.dwarf_faacfb::InfoWriter::SetBool
              ((InfoWriter *)local_60,&local_80,(bool)(this->MultiConfig & 1));
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"VERBOSITY",&local_b9);
    anon_unknown.dwarf_faacfb::InfoWriter::SetUInt((InfoWriter *)local_60,&local_b8,this->Verbosity)
    ;
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"LOCK_FILE",&local_e1);
    anon_unknown.dwarf_faacfb::InfoWriter::Set((InfoWriter *)local_60,&local_e0,&value->LockFile);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"SETTINGS_FILE",&local_109);
    anon_unknown.dwarf_faacfb::InfoWriter::SetConfig
              ((InfoWriter *)local_60,&local_108,&value->SettingsFile);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"CMAKE_SOURCE_DIR",&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"CMAKE_SOURCE_DIR",&local_179);
    SetupWriteRccInfo::anon_class_8_1_8991fb9c::operator()
              (&local_158,(anon_class_8_1_8991fb9c *)&info.Value_.limit_,&local_178);
    anon_unknown.dwarf_faacfb::InfoWriter::Set((InfoWriter *)local_60,&local_130,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator(&local_179);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a0,"CMAKE_BINARY_DIR",&local_1a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"CMAKE_BINARY_DIR",&local_1e9);
    SetupWriteRccInfo::anon_class_8_1_8991fb9c::operator()
              (&local_1c8,(anon_class_8_1_8991fb9c *)&info.Value_.limit_,&local_1e8);
    anon_unknown.dwarf_faacfb::InfoWriter::Set((InfoWriter *)local_60,&local_1a0,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,"CMAKE_CURRENT_SOURCE_DIR",&local_211);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"CMAKE_CURRENT_SOURCE_DIR",&local_259);
    SetupWriteRccInfo::anon_class_8_1_8991fb9c::operator()
              (&local_238,(anon_class_8_1_8991fb9c *)&info.Value_.limit_,&local_258);
    anon_unknown.dwarf_faacfb::InfoWriter::Set((InfoWriter *)local_60,&local_210,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator(&local_259);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator(&local_211);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"CMAKE_CURRENT_BINARY_DIR",&local_281);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c8,"CMAKE_CURRENT_BINARY_DIR",&local_2c9);
    SetupWriteRccInfo::anon_class_8_1_8991fb9c::operator()
              (&local_2a8,(anon_class_8_1_8991fb9c *)&info.Value_.limit_,&local_2c8);
    anon_unknown.dwarf_faacfb::InfoWriter::Set((InfoWriter *)local_60,&local_280,&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::allocator<char>::~allocator(&local_2c9);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator(&local_281);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"BUILD_DIR",&local_2f1);
    anon_unknown.dwarf_faacfb::InfoWriter::Set((InfoWriter *)local_60,&local_2f0,&(this->Dir).Build)
    ;
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator(&local_2f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_318,"INCLUDE_DIR",&local_319);
    anon_unknown.dwarf_faacfb::InfoWriter::SetConfig
              ((InfoWriter *)local_60,&local_318,&(this->Dir).Include);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator(&local_319);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_340,"RCC_EXECUTABLE",&local_341);
    anon_unknown.dwarf_faacfb::InfoWriter::Set
              ((InfoWriter *)local_60,&local_340,&(this->Rcc).super_GenVarsT.Executable);
    std::__cxx11::string::~string((string *)&local_340);
    std::allocator<char>::~allocator(&local_341);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,"RCC_LIST_OPTIONS",&local_369);
    peVar2 = std::
             __shared_ptr_access<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->Rcc).super_GenVarsT.ExecutableFeatures);
    (anonymous_namespace)::InfoWriter::
    SetArray<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_60,&local_368,&peVar2->ListOptions);
    std::__cxx11::string::~string((string *)&local_368);
    std::allocator<char>::~allocator(&local_369);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"SOURCE",&local_391);
    anon_unknown.dwarf_faacfb::InfoWriter::Set((InfoWriter *)local_60,&local_390,&value->QrcFile);
    std::__cxx11::string::~string((string *)&local_390);
    std::allocator<char>::~allocator(&local_391);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b8,"OUTPUT_CHECKSUM",&local_3b9);
    anon_unknown.dwarf_faacfb::InfoWriter::Set
              ((InfoWriter *)local_60,&local_3b8,&value->QrcPathChecksum);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator(&local_3b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,"OUTPUT_NAME",&local_3e1);
    cmsys::SystemTools::GetFilenameName(&local_408,&value->OutputFile);
    anon_unknown.dwarf_faacfb::InfoWriter::Set((InfoWriter *)local_60,&local_3e0,&local_408);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::allocator<char>::~allocator(&local_3e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,"OPTIONS",&local_429);
    (anonymous_namespace)::InfoWriter::
    SetArray<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_60,&local_428,&value->Options);
    std::__cxx11::string::~string((string *)&local_428);
    std::allocator<char>::~allocator(&local_429);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"INPUTS",&local_451);
    (anonymous_namespace)::InfoWriter::
    SetArray<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_60,&local_450,&value->Resources);
    std::__cxx11::string::~string((string *)&local_450);
    std::allocator<char>::~allocator(&local_451);
    anon_unknown.dwarf_faacfb::InfoWriter::Save((InfoWriter *)local_60,&value->InfoFile);
    anon_unknown.dwarf_faacfb::InfoWriter::~InfoWriter((InfoWriter *)local_60);
    __gnu_cxx::
    __normal_iterator<cmQtAutoGenInitializer::Qrc_*,_std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>_>
    ::operator++(&__end1);
  }
  return true;
}

Assistant:

bool cmQtAutoGenInitializer::SetupWriteRccInfo()
{
  for (Qrc const& qrc : this->Rcc.Qrcs) {
    // Utility lambdas
    auto MfDef = [this](std::string const& key) {
      return this->Makefile->GetSafeDefinition(key);
    };

    InfoWriter info;

    // General
    info.SetBool("MULTI_CONFIG", this->MultiConfig);
    info.SetUInt("VERBOSITY", this->Verbosity);

    // Files
    info.Set("LOCK_FILE", qrc.LockFile);
    info.SetConfig("SETTINGS_FILE", qrc.SettingsFile);

    // Directories
    info.Set("CMAKE_SOURCE_DIR", MfDef("CMAKE_SOURCE_DIR"));
    info.Set("CMAKE_BINARY_DIR", MfDef("CMAKE_BINARY_DIR"));
    info.Set("CMAKE_CURRENT_SOURCE_DIR", MfDef("CMAKE_CURRENT_SOURCE_DIR"));
    info.Set("CMAKE_CURRENT_BINARY_DIR", MfDef("CMAKE_CURRENT_BINARY_DIR"));
    info.Set("BUILD_DIR", this->Dir.Build);
    info.SetConfig("INCLUDE_DIR", this->Dir.Include);

    // rcc executable
    info.Set("RCC_EXECUTABLE", this->Rcc.Executable);
    info.SetArray("RCC_LIST_OPTIONS",
                  this->Rcc.ExecutableFeatures->ListOptions);

    // qrc file
    info.Set("SOURCE", qrc.QrcFile);
    info.Set("OUTPUT_CHECKSUM", qrc.QrcPathChecksum);
    info.Set("OUTPUT_NAME", cmSystemTools::GetFilenameName(qrc.OutputFile));
    info.SetArray("OPTIONS", qrc.Options);
    info.SetArray("INPUTS", qrc.Resources);

    info.Save(qrc.InfoFile);
  }

  return true;
}